

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

Vec3fa __thiscall embree::XML::parm_Vec3fa(XML *this,string *parmID)

{
  undefined8 uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ulong uVar4;
  Vec3fa VVar5;
  const_iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  string local_120 [36];
  undefined4 local_fc;
  undefined4 local_f8;
  uint local_f4;
  undefined1 local_ed;
  string *in_stack_ffffffffffffff28;
  ParseLocation *in_stack_ffffffffffffff68;
  string local_80 [32];
  _Self local_60;
  _Self local_58 [4];
  undefined4 *local_38;
  ulong uStack_20;
  undefined4 local_4;
  
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffeb8,(key_type *)0x3c510a);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffeb8);
  bVar2 = std::operator==(local_58,&local_60);
  if (!bVar2) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x3c52a1);
    std::__cxx11::string::string(local_120,(string *)&ppVar3->second);
    string_to_Vec3f(in_stack_ffffffffffffff28);
    local_38 = &local_fc;
    local_4 = 0;
    uVar4 = (ulong)local_f4;
    uStack_20 = (ulong)local_f4;
    *(ulong *)in_RDI = CONCAT44(local_f8,local_fc);
    in_RDI->_M_string_length = uStack_20;
    uVar1 = std::__cxx11::string::~string(local_120);
    VVar5.field_0._8_8_ = uVar4;
    VVar5.field_0._0_8_ = uVar1;
    return (Vec3fa)VVar5.field_0;
  }
  local_ed = 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff68);
  std::operator+(in_RDI,(char *)__rhs);
  std::operator+(in_RDI,__rhs);
  std::operator+(in_RDI,(char *)__rhs);
  std::runtime_error::runtime_error((runtime_error *)__rhs,local_80);
  local_ed = 0;
  __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3fa parm_Vec3fa(const std::string& parmID) const {
      std::map<std::string,std::string>::const_iterator i = parms.find(parmID);
      if (i == parms.end()) THROW_RUNTIME_ERROR (loc.str()+": XML node has no parameter \"" + parmID + "\"");
      return Vec3fa(string_to_Vec3f(i->second));
    }